

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CharItem.cpp
# Opt level: O0

void __thiscall Hpipe::CharItem::write_dot_rec(CharItem *this,ostream *os)

{
  bool bVar1;
  ostream *poVar2;
  reference pCVar3;
  size_type sVar4;
  CharEdge *t;
  const_iterator __end1;
  const_iterator __begin1;
  Vec<Hpipe::CharEdge> *__range1;
  int cpt;
  ostream *os_local;
  CharItem *this_local;
  
  if (this->op_id != cur_op_id) {
    this->op_id = cur_op_id;
    poVar2 = std::operator<<(os,"  node_");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,this);
    std::operator<<(poVar2," [label=\"");
    dot_out<Hpipe::CharItem>(os,this,-1);
    std::operator<<(os,"\"");
    std::operator<<(os,"];\n");
    __range1._4_4_ = 0;
    __end1 = std::vector<Hpipe::CharEdge,_std::allocator<Hpipe::CharEdge>_>::begin
                       (&(this->edges).
                         super_vector<Hpipe::CharEdge,_std::allocator<Hpipe::CharEdge>_>);
    t = (CharEdge *)
        std::vector<Hpipe::CharEdge,_std::allocator<Hpipe::CharEdge>_>::end
                  (&(this->edges).super_vector<Hpipe::CharEdge,_std::allocator<Hpipe::CharEdge>_>);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end1,(__normal_iterator<const_Hpipe::CharEdge_*,_std::vector<Hpipe::CharEdge,_std::allocator<Hpipe::CharEdge>_>_>
                                       *)&t), bVar1) {
      pCVar3 = __gnu_cxx::
               __normal_iterator<const_Hpipe::CharEdge_*,_std::vector<Hpipe::CharEdge,_std::allocator<Hpipe::CharEdge>_>_>
               ::operator*(&__end1);
      if (pCVar3->item != (CharItem *)0x0) {
        write_dot_rec(pCVar3->item,os);
      }
      poVar2 = std::operator<<(os,"  node_");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,this);
      poVar2 = std::operator<<(poVar2," -> node_");
      std::ostream::operator<<(poVar2,pCVar3->item);
      sVar4 = std::vector<Hpipe::CharEdge,_std::allocator<Hpipe::CharEdge>_>::size
                        (&(this->edges).
                          super_vector<Hpipe::CharEdge,_std::allocator<Hpipe::CharEdge>_>);
      if (1 < sVar4) {
        poVar2 = std::operator<<(os," [label=\"");
        poVar2 = (ostream *)std::ostream::operator<<(poVar2,__range1._4_4_);
        std::operator<<(poVar2,"\"]");
        __range1._4_4_ = __range1._4_4_ + 1;
      }
      std::operator<<(os,";\n");
      __gnu_cxx::
      __normal_iterator<const_Hpipe::CharEdge_*,_std::vector<Hpipe::CharEdge,_std::allocator<Hpipe::CharEdge>_>_>
      ::operator++(&__end1);
    }
  }
  return;
}

Assistant:

void CharItem::write_dot_rec( std::ostream &os ) const {
    if ( op_id == CharItem::cur_op_id )
        return;
    op_id = CharItem::cur_op_id;

    os << "  node_" << this << " [label=\"";
    dot_out( os, *this );
    os << "\"";
    //if ( leads_to_ok )
    //    os << ",style=dotted";
    os << "];\n";

    int cpt = 0;
    for( const CharEdge &t : edges ) {
        if ( t.item )
            t.item->write_dot_rec( os );
        os << "  node_" << this << " -> node_" << t.item;
        if ( this->edges.size() >= 2 )
            os << " [label=\"" << cpt++ << "\"]";
        os << ";\n";
    }
}